

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphinx_fe.c
# Opt level: O1

int output_header_htk(sphinx_wave2feat_t *wtf,int32 nfloat)

{
  int iVar1;
  uint uVar2;
  char *__s2;
  size_t sVar3;
  long lVar4;
  ushort uVar5;
  int iVar6;
  double dVar7;
  uint local_24;
  ushort local_20;
  ushort local_1e;
  uint local_1c;
  
  local_24 = nfloat;
  __s2 = cmd_ln_str_r(wtf->config,"-mach_endian");
  iVar1 = strcmp("little",__s2);
  if (iVar1 == 0) {
    local_24 = (uint)nfloat >> 0x18 | (nfloat & 0xff0000U) >> 8 | (nfloat & 0xff00U) << 8 |
               nfloat << 0x18;
  }
  sVar3 = fwrite(&local_24,4,1,(FILE *)wtf->outfh);
  iVar6 = -1;
  if (sVar3 == 1) {
    dVar7 = cmd_ln_float_r(wtf->config,"-frate");
    uVar2 = (uint)(1e+07 / (float)dVar7);
    local_1c = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    if (iVar1 != 0) {
      local_1c = uVar2;
    }
    sVar3 = fwrite(&local_1c,4,1,(FILE *)wtf->outfh);
    if (sVar3 == 1) {
      uVar5 = (ushort)(wtf->veclen << 2);
      local_1e = uVar5 << 8 | uVar5 >> 8;
      if (iVar1 != 0) {
        local_1e = uVar5;
      }
      sVar3 = fwrite(&local_1e,2,1,(FILE *)wtf->outfh);
      if (sVar3 == 1) {
        lVar4 = cmd_ln_int_r(wtf->config,"-logspec");
        uVar5 = 7;
        if (lVar4 == 0) {
          lVar4 = cmd_ln_int_r(wtf->config,"-cep2spec");
          uVar5 = 7;
          if (lVar4 == 0) {
            uVar5 = 0x2006;
          }
        }
        local_20 = uVar5 << 8 | uVar5 >> 8;
        if (iVar1 != 0) {
          local_20 = uVar5;
        }
        sVar3 = fwrite(&local_20,2,1,(FILE *)wtf->outfh);
        iVar6 = -(uint)(sVar3 != 1);
      }
    }
  }
  return iVar6;
}

Assistant:

static int
output_header_htk(sphinx_wave2feat_t *wtf, int32 nfloat)
{
    int32 samp_period;
    int16 samp_size;
    int16 param_kind;
    int swap = FALSE;

    /* HTK files are big-endian. */
    if (0 == strcmp("little", cmd_ln_str_r(wtf->config, "-mach_endian")))
        swap = TRUE;
    /* Same file size thing as in Sphinx files (I think) */
    if (swap) SWAP_INT32(&nfloat);
    if (fwrite(&nfloat, 4, 1, wtf->outfh) != 1)
        return -1;
    /* Sample period in 100ns units. */
    samp_period = (int32)(1e+7 / cmd_ln_float32_r(wtf->config, "-frate"));
    if (swap) SWAP_INT32(&samp_period);
    if (fwrite(&samp_period, 4, 1, wtf->outfh) != 1)
        return -1;
    /* Sample size - veclen * sizeof each sample. */
    samp_size = wtf->veclen * 4;
    if (swap) SWAP_INT16(&samp_size);
    if (fwrite(&samp_size, 2, 1, wtf->outfh) != 1)
        return -1;
    /* Format and flags. */
    if (cmd_ln_boolean_r(wtf->config, "-logspec")
        || cmd_ln_boolean_r(wtf->config, "-cep2spec"))
        param_kind = FBANK; /* log mel-filter bank outputs */
    else
        param_kind = MFCC | _O; /* MFCC + CEP0 (note reordering...) */
    if (swap) SWAP_INT16(&param_kind);
    if (fwrite(&param_kind, 2, 1, wtf->outfh) != 1)
        return -1;

    return 0;
}